

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_stack.h
# Opt level: O2

void * uo_stack_pop(uo_stack *stack)

{
  size_t sVar1;
  void *pvVar2;
  void **ppvVar3;
  ulong uVar4;
  
  sVar1 = stack->count;
  if (sVar1 != 0) {
    uVar4 = sVar1 - 1;
    stack->count = uVar4;
    pvVar2 = stack->items[sVar1 - 1];
    if (3 < uVar4 && uVar4 == stack->capacity >> 3) {
      uVar4 = stack->capacity >> 1;
      stack->capacity = uVar4;
      ppvVar3 = (void **)realloc(stack->items,uVar4 << 3);
      stack->items = ppvVar3;
    }
    return pvVar2;
  }
  __assert_fail("stack->count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_stack/src/include/uo_stack/uo_stack.h"
                ,0x97,"void *uo_stack_pop(uo_stack *)");
}

Assistant:

static inline void *uo_stack_pop(
    uo_stack *stack)
{
    assert(stack->count);

    size_t count = --stack->count;
    void *item = stack->items[count];

    if (count == stack->capacity >> 3 && count >= UO_STACK_MIN_CAPACITY)
        stack->items = realloc(stack->items, sizeof *stack->items * (stack->capacity >>= 1));

    return item;
}